

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

uint64_t roaring64_iterator_read(roaring64_iterator_t *it,uint64_t *buf,uint64_t count)

{
  ushort *puVar1;
  long lVar2;
  _Bool _Var3;
  _Bool _Var4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint16_t low16;
  uint64_t local_50;
  uint32_t container_consumed;
  art_iterator_t *local_40;
  ulong local_38;
  
  local_40 = &it->art_it;
  uVar9 = 0;
  local_38 = count;
  while( true ) {
    if (it->has_value != true) {
      return uVar9;
    }
    uVar11 = local_38 - uVar9;
    if (local_38 < uVar9 || uVar11 == 0) break;
    uVar5 = *(it->art_it).value;
    low16 = (uint16_t)it->value;
    if (0xfffffffe < uVar11) {
      uVar11 = 0xffffffff;
    }
    _Var3 = container_iterator_read_into_uint64
                      (it->r->containers[uVar5 >> 8],(uint8_t)uVar5,&it->container_it,it->high48,buf
                       ,(uint32_t)uVar11,&container_consumed,&low16);
    uVar11 = (ulong)container_consumed;
    uVar9 = uVar9 + uVar11;
    if (_Var3) {
      it->has_value = true;
      it->value = (ulong)low16 | it->high48;
      local_50 = uVar9;
    }
    else {
      _Var4 = art_iterator_move(local_40,true);
      it->has_value = _Var4;
      if (_Var4) {
        uVar5 = (ulong)*(ushort *)((it->art_it).key + 4) << 0x20;
        uVar6 = (ulong)*(uint6 *)(it->art_it).key;
        uVar6 = (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28 |
                uVar6 << 0x38;
        it->high48 = uVar6;
        uVar5 = *(it->art_it).value;
        puVar1 = *(ushort **)((long)it->r->containers[uVar5 >> 8] + 8);
        if (((char)uVar5 == '\x03') || (((uint)uVar5 & 0xff) == 2)) {
          uVar7 = (uint)*puVar1;
          uVar10 = 0;
        }
        else {
          uVar10 = 0;
          iVar8 = -0x40;
          do {
            uVar5 = *(ulong *)(puVar1 + (ulong)uVar10 * 4);
            uVar10 = uVar10 + 1;
            iVar8 = iVar8 + 0x40;
          } while (uVar5 == 0);
          lVar2 = 0;
          if (uVar5 != 0) {
            for (; (uVar5 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
            }
          }
          uVar7 = (int)lVar2 + iVar8;
          uVar10 = uVar7;
        }
        (it->container_it).index = uVar10;
        it->value = uVar6 | uVar7 & 0xffff;
        it->has_value = true;
      }
    }
    buf = buf + uVar11;
    if (_Var3) {
      return local_50;
    }
  }
  return uVar9;
}

Assistant:

uint64_t roaring64_iterator_read(roaring64_iterator_t *it, uint64_t *buf,
                                 uint64_t count) {
    uint64_t consumed = 0;
    while (it->has_value && consumed < count) {
        uint32_t container_consumed;
        leaf_t leaf = (leaf_t)*it->art_it.value;
        uint16_t low16 = (uint16_t)it->value;
        uint32_t container_count = UINT32_MAX;
        if (count - consumed < (uint64_t)UINT32_MAX) {
            container_count = count - consumed;
        }
        bool has_value = container_iterator_read_into_uint64(
            get_container(it->r, leaf), get_typecode(leaf), &it->container_it,
            it->high48, buf, container_count, &container_consumed, &low16);
        consumed += container_consumed;
        buf += container_consumed;
        if (has_value) {
            it->has_value = true;
            it->value = it->high48 | low16;
            assert(consumed == count);
            return consumed;
        }
        it->has_value = art_iterator_next(&it->art_it);
        if (it->has_value) {
            roaring64_iterator_init_at_leaf_first(it);
        }
    }
    return consumed;
}